

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

IVec2 __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::getOrigin
          (RandomizedRenderGrid *this)

{
  long in_RSI;
  Vector<int,_2> local_28;
  Vector<int,_2> local_20;
  
  local_28.m_data[0] = *(int *)(in_RSI + 0x18) + -1;
  local_28.m_data[1] = local_28.m_data[0] / *(int *)(in_RSI + 0x10);
  local_28.m_data[0] = local_28.m_data[0] % *(int *)(in_RSI + 0x10);
  tcu::operator*(&local_28,(Vector<int,_2> *)(in_RSI + 8));
  tcu::operator+(&local_20,(Vector<int,_2> *)(in_RSI + 0x20));
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 RandomizedRenderGrid::getOrigin (void) const
{
	const int	gridX		  = (m_currentCell - 1) % m_grid.x();
	const int	gridY		  = (m_currentCell - 1) / m_grid.x();
	const IVec2 currentOrigin = (IVec2(gridX, gridY) * m_cellSize) + m_baseRandomOffset;

	DE_ASSERT(currentOrigin.x() >= 0 && (currentOrigin.x() + m_cellSize.x()) <= m_targetSize.x());
	DE_ASSERT(currentOrigin.y() >= 0 && (currentOrigin.y() + m_cellSize.y()) <= m_targetSize.y());

	return currentOrigin;
}